

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zuncompress.c
# Opt level: O0

void write_buf(voidp buf,uint cnt)

{
  size_t sVar1;
  void *pvVar2;
  uint in_ESI;
  void *in_RDI;
  
  if (realloc_fn == (_func_void_ptr_void_ptr_size_t *)0x0) {
    sVar1 = fwrite(in_RDI,1,(ulong)in_ESI,(FILE *)ofd);
    if (sVar1 != in_ESI) {
      error((char *)0x26a328);
      exit_code = 1;
    }
  }
  else {
    if (*memsize < bytes_out + (ulong)in_ESI) {
      pvVar2 = (*realloc_fn)(*memptr,bytes_out + (ulong)in_ESI);
      *memptr = pvVar2;
      *memsize = bytes_out + (ulong)in_ESI;
      if (*memptr == (void *)0x0) {
        error((char *)0x26a3b5);
        exit_code = 1;
        return;
      }
    }
    memcpy((void *)((long)*memptr + bytes_out),in_RDI,(ulong)in_ESI);
  }
  return;
}

Assistant:

local void write_buf(voidp buf, unsigned cnt)
/*              copy buffer into memory; allocate more memory if required*/
{
    if (!realloc_fn)
    {
      /* append buffer to file */
      /* added 'unsigned' to get rid of compiler warning (WDP 1/1/99) */
      if ((unsigned long) fwrite(buf, 1, cnt, ofd) != cnt)
      {
          error
          ("failed to write buffer to uncompressed output file (write_buf)");
          exit_code = ERROR;
          return;
      }
    }
    else
    {
      /* get more memory if current buffer is too small */
      if (bytes_out + cnt > *memsize)
      {
        *memptr = realloc_fn(*memptr, bytes_out + cnt);
        *memsize = bytes_out + cnt;  /* new memory buffer size */

        if (!(*memptr))
        {
            error("malloc failed while uncompressing (write_buf)");
            exit_code = ERROR;
            return;
        }  
      }
      /* copy  into memory buffer */
      memcpy((char *) *memptr + bytes_out, (char *) buf, cnt);
    }
}